

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O1

int main(int argc,char **argv)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  bool bVar2;
  int iVar3;
  string fileName;
  TimeUsage timer;
  Steiner st;
  allocator local_2a1;
  string local_2a0;
  int local_27c;
  undefined1 *local_278 [2];
  undefined1 local_268 [16];
  undefined1 local_258 [16];
  undefined1 local_248 [16];
  undefined1 local_238 [16];
  undefined1 local_228 [72];
  undefined1 local_1e0 [16];
  undefined1 local_1d0 [16];
  undefined1 local_1c0 [16];
  undefined1 local_1b0 [16];
  undefined1 local_1a0 [12];
  undefined4 uStack_194;
  undefined1 auStack_190 [12];
  _Bit_type *local_180;
  uint local_178;
  undefined1 local_170 [16];
  undefined1 local_160 [16];
  undefined1 local_150 [16];
  undefined1 local_140 [16];
  undefined1 local_130 [12];
  undefined4 uStack_124;
  undefined1 auStack_120 [12];
  _Bit_type *local_110;
  uint local_108;
  undefined1 local_100 [216];
  
  local_27c = argc;
  std::ios_base::sync_with_stdio(false);
  *(undefined8 *)(*(long *)(std::cin + -0x18) + 0x1112c0) = 0;
  local_238 = (undefined1  [16])0x0;
  local_248 = (undefined1  [16])0x0;
  local_258 = (undefined1  [16])0x0;
  TimeUsage::checkUsage((TimeUsage *)local_258,(TimeState *)local_258);
  TimeUsage::checkUsage((TimeUsage *)local_258,(TimeState *)(local_248 + 8));
  bVar2 = handleArgument(&local_27c,argv);
  iVar3 = -1;
  if (bVar2) {
    std::__cxx11::string::string((string *)local_278,argv[1],(allocator *)local_228);
    local_228._0_8_ = local_228 + 0x10;
    local_228._8_8_ = 0;
    local_228[0x10] = '\0';
    local_228._32_4_ = -1;
    local_228._36_4_ = -1;
    local_228._40_4_ = -1;
    local_228._44_4_ = -1;
    local_180 = (_Bit_type *)0x0;
    local_178 = 0;
    local_110 = (_Bit_type *)0x0;
    local_108 = 0;
    local_228._56_16_ = (undefined1  [16])0x0;
    local_1e0 = (undefined1  [16])0x0;
    local_1d0 = (undefined1  [16])0x0;
    local_1c0 = (undefined1  [16])0x0;
    local_1b0 = (undefined1  [16])0x0;
    local_1a0 = SUB1612((undefined1  [16])0x0,0);
    uStack_194 = 0;
    auStack_190 = SUB1612((undefined1  [16])0x0,4);
    local_170 = (undefined1  [16])0x0;
    local_160 = (undefined1  [16])0x0;
    local_150 = (undefined1  [16])0x0;
    local_140 = (undefined1  [16])0x0;
    local_130 = SUB1612((undefined1  [16])0x0,0);
    uStack_124 = 0;
    auStack_120 = SUB1612((undefined1  [16])0x0,4);
    memset(local_100,0,0xd8);
    std::__cxx11::string::string((string *)&local_2a0,argv[1],&local_2a1);
    Steiner::parse((Steiner *)local_228,&local_2a0);
    paVar1 = &local_2a0.field_2;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_2a0._M_dataplus._M_p != paVar1) {
      operator_delete(local_2a0._M_dataplus._M_p);
    }
    Steiner::solve((Steiner *)local_228);
    if (gDoplot == true) {
      Steiner::plot((Steiner *)local_228,&plotName_abi_cxx11_);
    }
    if (gOutfile == true) {
      Steiner::outfile((Steiner *)local_228,&outfileName_abi_cxx11_);
    }
    local_2a0._M_dataplus._M_p = (pointer)paVar1;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_2a0,"Steiner","");
    TimeUsage::showUsage((TimeUsage *)local_258,&local_2a0,FULL);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_2a0._M_dataplus._M_p != paVar1) {
      operator_delete(local_2a0._M_dataplus._M_p);
    }
    Steiner::~Steiner((Steiner *)local_228);
    if (local_278[0] != local_268) {
      operator_delete(local_278[0]);
    }
    iVar3 = 0;
  }
  return iVar3;
}

Assistant:

int main(int argc, char** argv) {
  ios::sync_with_stdio(false);
  cin.tie(0);
  TimeUsage timer;
  if (!handleArgument(argc, argv)) return -1;
  string fileName = argv[1];
  Steiner st;
  st.parse(argv[1]);
  st.solve();
#ifdef VERBOSE
  timer.showUsage("solve", TimeUsage::PARTIAL);
  timer.start(TimeUsage::PARTIAL);
#endif
  if (gDoplot) {
    st.plot(plotName);
#ifdef VERBOSE    
    timer.showUsage("plot", TimeUsage::PARTIAL);
    timer.start(TimeUsage::PARTIAL);
#endif
  }
  if (gOutfile) {
    st.outfile(outfileName);
#ifdef VERBOSE
    timer.showUsage("outfile", TimeUsage::PARTIAL);
    timer.start(TimeUsage::PARTIAL);
#endif
  }
  timer.showUsage("Steiner", TimeUsage::FULL);
  return 0;
}